

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  Floor *pFVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint16 uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  int32 n;
  Floor *pFVar10;
  int16 *piVar11;
  float *pfVar12;
  short *psVar13;
  uint uVar14;
  int *piVar15;
  int iVar16;
  uint32 uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint8 *puVar23;
  long lVar24;
  ulong uVar25;
  short sVar26;
  byte *pbVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  float *pfVar34;
  uint uVar35;
  float *a;
  ulong uVar36;
  int iVar37;
  long lVar38;
  uint uVar39;
  int iVar40;
  int iVar41;
  Codebook *pCVar42;
  long lVar43;
  bool bVar44;
  float fVar45;
  float fVar46;
  int n2;
  int right_end;
  int mode;
  int left_end;
  float *residue_buffers [16];
  int really_zero_channel [256];
  int zero_channel [256];
  int local_9e8;
  int local_9e4;
  int *local_9e0;
  long local_9d8;
  int *local_9d0;
  long local_9c8;
  int local_9bc;
  float *local_9b8 [16];
  uint8 local_938 [256];
  undefined4 local_838;
  int local_438 [258];
  
  local_9e0 = len;
  iVar16 = vorbis_decode_initial(f,p_left,&local_9bc,p_right,&local_9e8,&local_9e4);
  if (iVar16 == 0) {
LAB_0011f09f:
    iVar16 = 0;
  }
  else {
    lVar22 = (long)local_9e4;
    local_9d8 = lVar22 * 3;
    iVar16 = *p_left;
    iVar9 = *p_right;
    iVar21 = f->blocksize[f->mode_config[lVar22].blockflag];
    puVar23 = f->mapping->submap_floor +
              ((ulong)((uint)f->mode_config[lVar22].mapping * 0x30) - 0x11);
    iVar18 = f->channels;
    local_9d0 = p_left;
    if (0 < iVar18) {
      lVar22 = 0;
      do {
        bVar3 = *(byte *)(*(long *)(puVar23 + 8) + 2 + lVar22 * 3);
        local_438[lVar22] = 0;
        uVar32 = (ulong)puVar23[(ulong)bVar3 + 0x11];
        uVar6 = f->floor_types[uVar32];
        if (uVar6 == 0) {
          f->error = VORBIS_invalid_stream;
        }
        else {
          pFVar10 = f->floor_config;
          uVar17 = get_bits(f,1);
          if (uVar17 != 0) {
            local_9c8 = uVar32 * 0x63c;
            pFVar1 = pFVar10 + uVar32;
            n = *(int32 *)("" + (ulong)(pFVar1->floor1).floor1_multiplier * 4 + 0xc);
            piVar11 = f->finalY[lVar22];
            iVar18 = ilog(n);
            uVar17 = get_bits(f,iVar18 + -1);
            *piVar11 = (int16)uVar17;
            uVar17 = get_bits(f,iVar18 + -1);
            piVar11[1] = (int16)uVar17;
            if ((pFVar1->floor0).order != '\0') {
              lVar38 = 2;
              uVar32 = 0;
              do {
                bVar3 = *(byte *)((long)pFVar1 + uVar32 + 1);
                uVar36 = (ulong)bVar3;
                uVar20 = (uint)*(byte *)((long)pFVar1 + uVar36 + 0x21);
                bVar4 = *(byte *)((long)pFVar1 + uVar36 + 0x31);
                if (bVar4 == 0) {
                  uVar31 = 0;
                }
                else {
                  pCVar42 = f->codebooks + *(byte *)((long)pFVar1 + uVar36 + 0x41);
                  if (f->valid_bits < 10) {
                    if (f->valid_bits == 0) {
                      f->acc = 0;
                    }
                    do {
                      if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                         (iVar18 = get8_packet_raw(f), iVar18 == -1)) break;
                      iVar19 = f->valid_bits;
                      f->acc = f->acc + (iVar18 << ((byte)iVar19 & 0x1f));
                      f->valid_bits = iVar19 + 8;
                    } while (iVar19 < 0x11);
                  }
                  sVar26 = pCVar42->fast_huffman[f->acc & 0x3ff];
                  if (sVar26 < 0) {
                    uVar31 = codebook_decode_scalar_raw(f,pCVar42);
                  }
                  else {
                    bVar5 = pCVar42->codeword_lengths[(int)sVar26];
                    f->acc = f->acc >> (bVar5 & 0x1f);
                    iVar18 = f->valid_bits - (uint)bVar5;
                    bVar44 = iVar18 < 0;
                    if (iVar18 < 1) {
                      iVar18 = 0;
                    }
                    uVar31 = (int)sVar26;
                    if (bVar44) {
                      uVar31 = 0xffffffff;
                    }
                    f->valid_bits = iVar18;
                  }
                  if (pCVar42->sparse != '\0') {
                    uVar31 = pCVar42->sorted_values[(int)uVar31];
                  }
                }
                if (uVar20 != 0) {
                  lVar38 = (long)(int)lVar38;
                  uVar39 = 0;
                  do {
                    lVar24 = (long)*(short *)((long)pFVar1 +
                                             (ulong)(uVar31 & ~(-1 << (bVar4 & 0x1f))) * 2 +
                                             (ulong)bVar3 * 0x10 + 0x52);
                    uVar31 = (int)uVar31 >> (bVar4 & 0x1f);
                    if (lVar24 < 0) {
                      iVar18 = 0;
                    }
                    else {
                      pCVar42 = f->codebooks + lVar24;
                      if (f->valid_bits < 10) {
                        if (f->valid_bits == 0) {
                          f->acc = 0;
                        }
                        do {
                          if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                             (iVar18 = get8_packet_raw(f), iVar18 == -1)) break;
                          iVar19 = f->valid_bits;
                          f->acc = f->acc + (iVar18 << ((byte)iVar19 & 0x1f));
                          f->valid_bits = iVar19 + 8;
                        } while (iVar19 < 0x11);
                      }
                      iVar18 = (int)pCVar42->fast_huffman[f->acc & 0x3ff];
                      if (pCVar42->fast_huffman[f->acc & 0x3ff] < 0) {
                        iVar18 = codebook_decode_scalar_raw(f,pCVar42);
                      }
                      else {
                        bVar5 = pCVar42->codeword_lengths[iVar18];
                        f->acc = f->acc >> (bVar5 & 0x1f);
                        iVar28 = f->valid_bits - (uint)bVar5;
                        iVar19 = iVar28;
                        if (iVar28 < 1) {
                          iVar19 = 0;
                        }
                        if (iVar28 < 0) {
                          iVar18 = -1;
                        }
                        f->valid_bits = iVar19;
                      }
                      if (pCVar42->sparse != '\0') {
                        iVar18 = pCVar42->sorted_values[iVar18];
                      }
                    }
                    piVar11[lVar38] = (int16)iVar18;
                    lVar38 = lVar38 + 1;
                    uVar39 = uVar39 + 1;
                  } while (uVar39 != uVar20);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 < (pFVar1->floor0).order);
            }
            lVar38 = local_9c8;
            if (f->valid_bits != -1) {
              local_838._0_2_ = 0x101;
              uVar20 = (pFVar1->floor1).values;
              if (2 < (int)uVar20) {
                lVar24 = local_9c8 + 0x445;
                lVar33 = 0;
                do {
                  bVar3 = *(byte *)((long)pFVar10 + lVar33 * 2 + lVar38 + 0x444);
                  bVar4 = *(byte *)((long)pFVar10 + lVar33 * 2 + lVar24);
                  uVar7 = *(ushort *)((long)pFVar10 + lVar33 * 2 + lVar38 + 0x156);
                  uVar20 = (uint)*(ushort *)
                                  ((long)pFVar1 + (ulong)((uint)bVar3 + (uint)bVar3) + 0x152);
                  uVar8 = *(ushort *)((long)pFVar1 + (ulong)((uint)bVar4 + (uint)bVar4) + 0x152);
                  iVar40 = (int)*(short *)((long)piVar11 + (ulong)((uint)bVar3 + (uint)bVar3));
                  iVar28 = (int)*(short *)((long)piVar11 + (ulong)((uint)bVar4 + (uint)bVar4));
                  iVar18 = SDL_abs(iVar28 - iVar40);
                  iVar19 = (int)(iVar18 * (uVar7 - uVar20)) / (int)(uVar8 - uVar20);
                  iVar18 = -iVar19;
                  if (-1 < iVar28 - iVar40) {
                    iVar18 = iVar19;
                  }
                  iVar18 = iVar18 + iVar40;
                  sVar26 = piVar11[lVar33 + 2];
                  uVar20 = (uint)sVar26;
                  if (sVar26 == 0) {
                    *(undefined1 *)((long)&local_838 + lVar33 + 2) = 0;
LAB_0011ebb2:
                    sVar26 = (short)iVar18;
LAB_0011ebb7:
                    piVar11[lVar33 + 2] = sVar26;
                  }
                  else {
                    iVar28 = n - iVar18;
                    iVar19 = iVar18;
                    if (iVar28 < iVar18) {
                      iVar19 = iVar28;
                    }
                    *(undefined1 *)((long)&local_838 + (ulong)bVar4) = 1;
                    *(undefined1 *)((long)&local_838 + (ulong)bVar3) = 1;
                    *(undefined1 *)((long)&local_838 + lVar33 + 2) = 1;
                    if ((int)uVar20 < iVar19 * 2) {
                      if ((uVar20 & 1) == 0) {
                        iVar18 = iVar18 + (uVar20 >> 1);
                      }
                      else {
                        iVar18 = iVar18 - (uVar20 + 1 >> 1);
                      }
                      goto LAB_0011ebb2;
                    }
                    if (iVar28 <= iVar18) {
                      sVar26 = ((short)iVar18 - sVar26) + (short)iVar28 + -1;
                      goto LAB_0011ebb7;
                    }
                  }
                  uVar20 = (pFVar1->floor1).values;
                  lVar43 = lVar33 + 3;
                  lVar33 = lVar33 + 1;
                } while (lVar43 < (int)uVar20);
              }
              if (0 < (int)uVar20) {
                uVar32 = 0;
                do {
                  if (*(char *)((long)&local_838 + uVar32) == '\0') {
                    piVar11[uVar32] = -1;
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar20 != uVar32);
              }
              goto LAB_0011ec2c;
            }
          }
          local_438[lVar22] = 1;
        }
LAB_0011ec2c:
        if (uVar6 == 0) goto LAB_0011f09f;
        lVar22 = lVar22 + 1;
        iVar18 = f->channels;
      } while (lVar22 < iVar18);
    }
    SDL_memcpy(&local_838,local_438,(long)iVar18 << 2);
    uVar7 = *(ushort *)puVar23;
    if ((ulong)uVar7 != 0) {
      lVar22 = *(long *)(puVar23 + 8);
      lVar38 = 0;
      do {
        bVar3 = *(byte *)(lVar22 + lVar38);
        if ((local_438[bVar3] == 0) || (local_438[*(byte *)(lVar22 + 1 + lVar38)] == 0)) {
          local_438[*(byte *)(lVar22 + 1 + lVar38)] = 0;
          local_438[bVar3] = 0;
        }
        lVar38 = lVar38 + 3;
      } while ((ulong)uVar7 * 3 != lVar38);
    }
    uVar20 = iVar21 >> 1;
    if (puVar23[0x10] != '\0') {
      uVar32 = 0;
      do {
        iVar18 = f->channels;
        iVar19 = 0;
        if (0 < (long)iVar18) {
          pbVar27 = (byte *)(*(long *)(puVar23 + 8) + 2);
          lVar22 = 0;
          iVar19 = 0;
          do {
            if (uVar32 == *pbVar27) {
              if (local_438[lVar22] == 0) {
                local_938[iVar19] = '\0';
                pfVar34 = f->channel_buffers[lVar22];
              }
              else {
                local_938[iVar19] = '\x01';
                pfVar34 = (float *)0x0;
              }
              local_9b8[iVar19] = pfVar34;
              iVar19 = iVar19 + 1;
            }
            lVar22 = lVar22 + 1;
            pbVar27 = pbVar27 + 3;
          } while (iVar18 != lVar22);
        }
        decode_residue(f,local_9b8,iVar19,uVar20,(uint)puVar23[uVar32 + 0x20],local_938);
        uVar32 = uVar32 + 1;
      } while (uVar32 < puVar23[0x10]);
    }
    if ((ulong)*(ushort *)puVar23 != 0) {
      lVar22 = *(long *)(puVar23 + 8);
      uVar32 = (ulong)*(ushort *)puVar23;
      do {
        if (0 < (int)uVar20) {
          lVar38 = (uVar32 - 1) * 3;
          pfVar34 = f->channel_buffers[*(byte *)(lVar22 + lVar38)];
          pfVar12 = f->channel_buffers[*(byte *)(lVar22 + 1 + lVar38)];
          uVar36 = 0;
          do {
            fVar46 = pfVar34[uVar36];
            fVar2 = pfVar12[uVar36];
            fVar45 = fVar46;
            if (fVar46 <= 0.0) {
              if (fVar2 <= 0.0) {
                fVar45 = fVar46 - fVar2;
              }
              else {
                fVar46 = fVar2 + fVar46;
              }
            }
            else if (fVar2 <= 0.0) {
              fVar45 = fVar2 + fVar46;
            }
            else {
              fVar46 = fVar46 - fVar2;
            }
            pfVar34[uVar36] = fVar45;
            pfVar12[uVar36] = fVar46;
            uVar36 = uVar36 + 1;
          } while (uVar20 != uVar36);
        }
        bVar44 = 1 < (long)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar44);
    }
    if (0 < f->channels) {
      lVar22 = 0;
      do {
        pfVar34 = f->channel_buffers[lVar22];
        if ((&local_838)[lVar22] == 0) {
          uVar32 = (ulong)puVar23[(ulong)*(byte *)(*(long *)(puVar23 + 8) + 2 + lVar22 * 3) + 0x11];
          if (f->floor_types[uVar32] == 0) {
            f->error = VORBIS_invalid_stream;
          }
          else {
            psVar13 = f->finalY[lVar22];
            pFVar10 = f->floor_config;
            lVar38 = uVar32 * 0x63c;
            uVar31 = (uint)*(byte *)((long)pFVar10 + lVar38 + 0x634) * (int)*psVar13;
            uVar36 = 0;
            if (1 < *(int *)((long)pFVar10 + lVar38 + 0x638)) {
              uVar36 = 0;
              lVar24 = 1;
              do {
                uVar25 = (ulong)*(byte *)((long)pFVar10 + lVar24 + lVar38 + 0x346);
                iVar18 = (int)psVar13[uVar25];
                if (-1 < iVar18) {
                  uVar30 = (uint)(&pFVar10->floor1)[uVar32].floor1_multiplier * iVar18;
                  uVar7 = *(ushort *)((long)pFVar10 + uVar25 * 2 + lVar38 + 0x152);
                  uVar39 = (uint)uVar7;
                  iVar18 = (int)uVar36;
                  iVar19 = uVar39 - iVar18;
                  if (iVar19 == 0) {
                    uVar36 = (ulong)uVar7;
                    uVar31 = uVar30;
                  }
                  else {
                    iVar41 = uVar30 - uVar31;
                    iVar28 = SDL_abs(iVar41);
                    iVar40 = SDL_abs((long)iVar41 / (long)iVar19 & 0xffffffff);
                    uVar14 = uVar20;
                    if ((int)uVar39 < (int)uVar20) {
                      uVar14 = uVar39;
                    }
                    if ((iVar18 < (int)uVar14) &&
                       (pfVar34[uVar36] = inverse_db_table[uVar31 & 0xff] * pfVar34[uVar36],
                       iVar18 + 1 < (int)uVar14)) {
                      iVar29 = 0;
                      lVar33 = 1;
                      do {
                        iVar29 = iVar29 + (iVar28 - iVar40 * iVar19);
                        uVar35 = 0;
                        iVar37 = 0;
                        if (iVar19 <= iVar29) {
                          uVar35 = iVar41 >> 0x1f | 1;
                          iVar37 = iVar19;
                        }
                        uVar31 = uVar31 + (int)((long)iVar41 / (long)iVar19) + uVar35;
                        iVar29 = iVar29 - iVar37;
                        pfVar34[uVar36 + lVar33] =
                             inverse_db_table[uVar31 & 0xff] * pfVar34[uVar36 + lVar33];
                        lVar33 = lVar33 + 1;
                      } while (uVar14 - iVar18 != (int)lVar33);
                    }
                    uVar36 = (ulong)uVar39;
                    uVar31 = uVar30;
                  }
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < (&pFVar10->floor1)[uVar32].values);
            }
            if ((int)uVar36 < (int)uVar20) {
              fVar46 = inverse_db_table[(int)uVar31];
              do {
                pfVar34[uVar36] = pfVar34[uVar36] * fVar46;
                uVar36 = uVar36 + 1;
              } while ((long)(int)uVar20 != uVar36);
            }
          }
        }
        else {
          SDL_memset(pfVar34,0,(long)(int)uVar20 * 4);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < f->channels);
    }
    if (0 < f->channels) {
      lVar22 = local_9d8 * 2;
      lVar38 = 0;
      do {
        inverse_mdct(f->channel_buffers[lVar38],iVar21,f,
                     (uint)(&f->mode_config[0].blockflag)[lVar22]);
        lVar38 = lVar38 + 1;
      } while (lVar38 < f->channels);
    }
    piVar15 = local_9d0;
    do {
      iVar18 = get8_packet_raw(f);
    } while (iVar18 != -1);
    if (f->first_decode == '\0') {
      iVar21 = f->discard_samples_deferred;
      if (iVar21 != 0) {
        if (iVar21 < iVar9 - iVar16) {
          *piVar15 = iVar16 + iVar21;
          f->discard_samples_deferred = 0;
          iVar16 = iVar16 + iVar21;
        }
        else {
          f->discard_samples_deferred = iVar21 - (iVar9 - iVar16);
          *piVar15 = iVar9;
          iVar16 = iVar9;
        }
      }
    }
    else {
      f->current_loc = -uVar20;
      f->discard_samples_deferred = iVar21 - local_9e8;
      f->current_loc_valid = 1;
      f->first_decode = '\0';
    }
    if (f->last_seg_which == f->end_seg_with_known_loc) {
      if ((f->current_loc_valid != 0) && ((f->page_flag & 4) != 0)) {
        uVar31 = f->current_loc;
        uVar39 = f->known_loc_for_packet;
        uVar30 = (local_9e8 - iVar16) + uVar31;
        iVar21 = 0;
        if (uVar39 < uVar30) {
          iVar21 = uVar39 - uVar31;
          if (uVar39 < uVar31) {
            iVar21 = 0;
          }
          iVar18 = iVar21 + iVar16;
          if (local_9e8 <= iVar21 + iVar16) {
            iVar18 = local_9e8;
          }
          *local_9e0 = iVar18;
          f->current_loc = f->current_loc + iVar18;
          iVar21 = 1;
        }
        if (uVar39 < uVar30) {
          return iVar21;
        }
      }
      f->current_loc = (iVar16 - uVar20) + f->known_loc_for_packet;
      f->current_loc_valid = 1;
    }
    if (f->current_loc_valid != 0) {
      f->current_loc = f->current_loc + (iVar9 - iVar16);
    }
    *local_9e0 = local_9e8;
    iVar16 = 1;
  }
  return iVar16;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}